

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ReturningSubqueryVarSelect(Walker *NotUsed,Expr *pExpr)

{
  Expr *pExpr_local;
  Walker *NotUsed_local;
  
  if (((pExpr->flags & 0x1000) != 0) && ((((pExpr->x).pSelect)->selFlags & 0x20000000) != 0)) {
    pExpr->flags = pExpr->flags | 0x40;
  }
  return 0;
}

Assistant:

static int sqlite3ReturningSubqueryVarSelect(Walker *NotUsed, Expr *pExpr){
  UNUSED_PARAMETER(NotUsed);
  if( ExprUseXSelect(pExpr)
   && (pExpr->x.pSelect->selFlags & SF_Correlated)!=0
  ){
    testcase( ExprHasProperty(pExpr, EP_VarSelect) );
    ExprSetProperty(pExpr, EP_VarSelect);
  }
  return WRC_Continue;
}